

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

void __thiscall
Lib::Stack<Kernel::Rebalancing::Node>::Stack
          (Stack<Kernel::Rebalancing::Node> *this,Stack<Kernel::Rebalancing::Node> *s)

{
  BottomFirstIterator it;
  Node *pNVar1;
  size_t sVar2;
  
  sVar2 = s->_capacity;
  this->_capacity = sVar2;
  if (sVar2 == 0) {
    sVar2 = 0;
    pNVar1 = (Node *)0x0;
  }
  else {
    pNVar1 = (Node *)Lib::alloc(sVar2 << 4);
    sVar2 = this->_capacity;
  }
  this->_stack = pNVar1;
  this->_cursor = pNVar1;
  this->_end = pNVar1 + sVar2;
  it._pointer = s->_stack;
  it._afterLast = s->_cursor;
  loadFromIterator<Lib::Stack<Kernel::Rebalancing::Node>::BottomFirstIterator>(this,it);
  return;
}

Assistant:

Stack(const Stack& s)
   : _capacity(s._capacity)
  {
    if(_capacity) {
      void* mem = ALLOC_KNOWN(_capacity*sizeof(C),className());
      _stack = static_cast<C*>(mem);
    }
    else {
      _stack = 0;
    }
    _cursor = _stack;
    _end = _stack+_capacity;

    loadFromIterator(BottomFirstIterator(const_cast<Stack&>(s)));
  }